

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

int ma_device__jack_process_callback(ma_jack_nframes_t frameCount,void *pUserData)

{
  long lVar1;
  uint local_5c;
  float *pfStack_58;
  ma_jack_nframes_t iFrame_1;
  float *pSrc_1;
  float *pDst_1;
  float *pfStack_40;
  ma_jack_nframes_t iFrame;
  float *pDst;
  float *pSrc;
  ma_uint32 iChannel;
  ma_context *pContext;
  ma_device *pDevice;
  void *pUserData_local;
  ma_jack_nframes_t frameCount_local;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pDevice != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x515a,"int ma_device__jack_process_callback(ma_jack_nframes_t, void *)");
  }
  lVar1 = *pUserData;
  if (lVar1 == 0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x515d,"int ma_device__jack_process_callback(ma_jack_nframes_t, void *)");
  }
  if ((*(int *)((long)pUserData + 8) == 2) || (*(int *)((long)pUserData + 8) == 3)) {
    for (pSrc._4_4_ = 0; pSrc._4_4_ < *(uint *)((long)pUserData + 0x2bcc);
        pSrc._4_4_ = pSrc._4_4_ + 1) {
      pDst = (float *)(**(code **)(lVar1 + 0x180))
                                (*(undefined8 *)((long)pUserData + (ulong)pSrc._4_4_ * 8 + 0x5478),
                                 frameCount);
      if (pDst != (float *)0x0) {
        pfStack_40 = (float *)(*(long *)((long)pUserData + 0x5580) + (ulong)pSrc._4_4_ * 4);
        for (pDst_1._4_4_ = 0; pDst_1._4_4_ < frameCount; pDst_1._4_4_ = pDst_1._4_4_ + 1) {
          *pfStack_40 = *pDst;
          pfStack_40 = pfStack_40 + *(uint *)((long)pUserData + 0x2bcc);
          pDst = pDst + 1;
        }
      }
    }
    if (*(int *)((long)pUserData + 8) == 3) {
      ma_device__handle_duplex_callback_capture
                ((ma_device *)pUserData,frameCount,*(void **)((long)pUserData + 0x5580),
                 (ma_pcm_rb *)((long)pUserData + 0x5588));
    }
    else {
      ma_device__send_frames_to_client
                ((ma_device *)pUserData,frameCount,*(void **)((long)pUserData + 0x5580));
    }
  }
  if ((*(int *)((long)pUserData + 8) == 1) || (*(int *)((long)pUserData + 8) == 3)) {
    if (*(int *)((long)pUserData + 8) == 3) {
      ma_device__handle_duplex_callback_playback
                ((ma_device *)pUserData,frameCount,*(void **)((long)pUserData + 0x5578),
                 (ma_pcm_rb *)((long)pUserData + 0x5588));
    }
    else {
      ma_device__read_frames_from_client
                ((ma_device *)pUserData,frameCount,*(void **)((long)pUserData + 0x5578));
    }
    for (pSrc._4_4_ = 0; pSrc._4_4_ < *(uint *)((long)pUserData + 0x2f4);
        pSrc._4_4_ = pSrc._4_4_ + 1) {
      pSrc_1 = (float *)(**(code **)(lVar1 + 0x180))
                                  (*(undefined8 *)((long)pUserData + (ulong)pSrc._4_4_ * 8 + 0x5378)
                                   ,frameCount);
      if (pSrc_1 != (float *)0x0) {
        pfStack_58 = (float *)(*(long *)((long)pUserData + 0x5578) + (ulong)pSrc._4_4_ * 4);
        for (local_5c = 0; local_5c < frameCount; local_5c = local_5c + 1) {
          *pSrc_1 = *pfStack_58;
          pSrc_1 = pSrc_1 + 1;
          pfStack_58 = pfStack_58 + *(uint *)((long)pUserData + 0x2f4);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int ma_device__jack_process_callback(ma_jack_nframes_t frameCount, void* pUserData)
{
    ma_device* pDevice;
    ma_context* pContext;
    ma_uint32 iChannel;

    pDevice = (ma_device*)pUserData;
    MA_ASSERT(pDevice != NULL);

    pContext = pDevice->pContext;
    MA_ASSERT(pContext != NULL);

    if (pDevice->type == ma_device_type_capture || pDevice->type == ma_device_type_duplex) {
        /* Channels need to be interleaved. */
        for (iChannel = 0; iChannel < pDevice->capture.internalChannels; ++iChannel) {
            const float* pSrc = (const float*)((ma_jack_port_get_buffer_proc)pContext->jack.jack_port_get_buffer)((ma_jack_port_t*)pDevice->jack.pPortsCapture[iChannel], frameCount);
            if (pSrc != NULL) {
                float* pDst = pDevice->jack.pIntermediaryBufferCapture + iChannel;
                ma_jack_nframes_t iFrame;
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    *pDst = *pSrc;

                    pDst += pDevice->capture.internalChannels;
                    pSrc += 1;
                }
            }
        }

        if (pDevice->type == ma_device_type_duplex) {
            ma_device__handle_duplex_callback_capture(pDevice, frameCount, pDevice->jack.pIntermediaryBufferCapture, &pDevice->jack.duplexRB);
        } else {
            ma_device__send_frames_to_client(pDevice, frameCount, pDevice->jack.pIntermediaryBufferCapture);
        }
    }

    if (pDevice->type == ma_device_type_playback || pDevice->type == ma_device_type_duplex) {
        if (pDevice->type == ma_device_type_duplex) {
            ma_device__handle_duplex_callback_playback(pDevice, frameCount, pDevice->jack.pIntermediaryBufferPlayback, &pDevice->jack.duplexRB);
        } else {
            ma_device__read_frames_from_client(pDevice, frameCount, pDevice->jack.pIntermediaryBufferPlayback);
        }

        /* Channels need to be deinterleaved. */
        for (iChannel = 0; iChannel < pDevice->playback.internalChannels; ++iChannel) {
            float* pDst = (float*)((ma_jack_port_get_buffer_proc)pContext->jack.jack_port_get_buffer)((ma_jack_port_t*)pDevice->jack.pPortsPlayback[iChannel], frameCount);
            if (pDst != NULL) {
                const float* pSrc = pDevice->jack.pIntermediaryBufferPlayback + iChannel;
                ma_jack_nframes_t iFrame;
                for (iFrame = 0; iFrame < frameCount; ++iFrame) {
                    *pDst = *pSrc;

                    pDst += 1;
                    pSrc += pDevice->playback.internalChannels;
                }
            }
        }
    }

    return 0;
}